

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateAnyMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableMessageGenerator *this_local;
  
  io::Printer::Print(printer,
                     "private static String getTypeUrl(\n    java.lang.String typeUrlPrefix,\n    com.google.protobuf.Descriptors.Descriptor descriptor) {\n  return typeUrlPrefix.endsWith(\"/\")\n      ? typeUrlPrefix + descriptor.getFullName()\n      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n}\n\nprivate static String getTypeNameFromTypeUrl(\n    java.lang.String typeUrl) {\n  int pos = typeUrl.lastIndexOf(\'/\');\n  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n}\n\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\n/**\n * Packs a message using the given type URL prefix. The type URL will\n * be constructed by concatenating the message type\'s full name to the\n * prefix with an optional \"/\" separator if the prefix doesn\'t end\n * with \"/\" already.\n */\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message, java.lang.String typeUrlPrefix) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\npublic <T extends com.google.protobuf.Message> boolean is(\n    java.lang.Class<T> clazz) {\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      defaultInstance.getDescriptorForType().getFullName());\n}\n\nprivate volatile com.google.protobuf.Message cachedUnpackValue;\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpack(\n    java.lang.Class<T> clazz)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  if (!is(clazz)) {\n    throw new com.google.protobuf.InvalidProtocolBufferException(\n        \"Type of the Any message does not match the given class.\");\n  }\n  if (cachedUnpackValue != null) {\n    return (T) cachedUnpackValue;\n ..." /* TRUNCATED STRING LITERAL */
                    );
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateAnyMethods(io::Printer* printer) {
  printer->Print(
    "private static String getTypeUrl(\n"
    "    java.lang.String typeUrlPrefix,\n"
    "    com.google.protobuf.Descriptors.Descriptor descriptor) {\n"
    "  return typeUrlPrefix.endsWith(\"/\")\n"
    "      ? typeUrlPrefix + descriptor.getFullName()\n"
    "      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n"
    "}\n"
    "\n"
    "private static String getTypeNameFromTypeUrl(\n"
    "    java.lang.String typeUrl) {\n"
    "  int pos = typeUrl.lastIndexOf('/');\n"
    "  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n"
    "}\n"
    "\n"
    "public static <T extends com.google.protobuf.Message> Any pack(\n"
    "    T message) {\n"
    "  return Any.newBuilder()\n"
    "      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n"
    "                             message.getDescriptorForType()))\n"
    "      .setValue(message.toByteString())\n"
    "      .build();\n"
    "}\n"
    "\n"
    "/**\n"
    " * Packs a message using the given type URL prefix. The type URL will\n"
    " * be constructed by concatenating the message type's full name to the\n"
    " * prefix with an optional \"/\" separator if the prefix doesn't end\n"
    " * with \"/\" already.\n"
    " */\n"
    "public static <T extends com.google.protobuf.Message> Any pack(\n"
    "    T message, java.lang.String typeUrlPrefix) {\n"
    "  return Any.newBuilder()\n"
    "      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n"
    "                             message.getDescriptorForType()))\n"
    "      .setValue(message.toByteString())\n"
    "      .build();\n"
    "}\n"
    "\n"
    "public <T extends com.google.protobuf.Message> boolean is(\n"
    "    java.lang.Class<T> clazz) {\n"
    "  T defaultInstance =\n"
    "      com.google.protobuf.Internal.getDefaultInstance(clazz);\n"
    "  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n"
    "      defaultInstance.getDescriptorForType().getFullName());\n"
    "}\n"
    "\n"
    "private volatile com.google.protobuf.Message cachedUnpackValue;\n"
    "\n"
    "@java.lang.SuppressWarnings(\"unchecked\")\n"
    "public <T extends com.google.protobuf.Message> T unpack(\n"
    "    java.lang.Class<T> clazz)\n"
    "    throws com.google.protobuf.InvalidProtocolBufferException {\n"
    "  if (!is(clazz)) {\n"
    "    throw new com.google.protobuf.InvalidProtocolBufferException(\n"
    "        \"Type of the Any message does not match the given class.\");\n"
    "  }\n"
    "  if (cachedUnpackValue != null) {\n"
    "    return (T) cachedUnpackValue;\n"
    "  }\n"
    "  T defaultInstance =\n"
    "      com.google.protobuf.Internal.getDefaultInstance(clazz);\n"
    "  T result = (T) defaultInstance.getParserForType()\n"
    "      .parseFrom(getValue());\n"
    "  cachedUnpackValue = result;\n"
    "  return result;\n"
    "}\n");
}